

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleDeception.cpp
# Opt level: O0

bool __thiscall DIS::AngleDeception::operator==(AngleDeception *this,AngleDeception *rhs)

{
  bool local_19;
  bool ivarsEqual;
  AngleDeception *rhs_local;
  AngleDeception *this_local;
  
  local_19 = this->_recordLength == rhs->_recordLength && this->_recordType == rhs->_recordType;
  if (this->_padding != rhs->_padding) {
    local_19 = false;
  }
  if (this->_emitterNumber != rhs->_emitterNumber) {
    local_19 = false;
  }
  if (this->_beamNumber != rhs->_beamNumber) {
    local_19 = false;
  }
  if (this->_stateIndicator != rhs->_stateIndicator) {
    local_19 = false;
  }
  if (this->_padding2 != rhs->_padding2) {
    local_19 = false;
  }
  if ((this->_azimuthOffset != rhs->_azimuthOffset) ||
     (NAN(this->_azimuthOffset) || NAN(rhs->_azimuthOffset))) {
    local_19 = false;
  }
  if ((this->_azimuthWidth != rhs->_azimuthWidth) ||
     (NAN(this->_azimuthWidth) || NAN(rhs->_azimuthWidth))) {
    local_19 = false;
  }
  if ((this->_azimuthPullRate != rhs->_azimuthPullRate) ||
     (NAN(this->_azimuthPullRate) || NAN(rhs->_azimuthPullRate))) {
    local_19 = false;
  }
  if ((this->_azimuthPullAcceleration != rhs->_azimuthPullAcceleration) ||
     (NAN(this->_azimuthPullAcceleration) || NAN(rhs->_azimuthPullAcceleration))) {
    local_19 = false;
  }
  if ((this->_elevationOffset != rhs->_elevationOffset) ||
     (NAN(this->_elevationOffset) || NAN(rhs->_elevationOffset))) {
    local_19 = false;
  }
  if ((this->_elevationWidth != rhs->_elevationWidth) ||
     (NAN(this->_elevationWidth) || NAN(rhs->_elevationWidth))) {
    local_19 = false;
  }
  if ((this->_elevationPullRate != rhs->_elevationPullRate) ||
     (NAN(this->_elevationPullRate) || NAN(rhs->_elevationPullRate))) {
    local_19 = false;
  }
  if ((this->_elevationPullAcceleration != rhs->_elevationPullAcceleration) ||
     (NAN(this->_elevationPullAcceleration) || NAN(rhs->_elevationPullAcceleration))) {
    local_19 = false;
  }
  if (this->_padding3 != rhs->_padding3) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool AngleDeception::operator ==(const AngleDeception& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_recordType == rhs._recordType) ) ivarsEqual = false;
     if( ! (_recordLength == rhs._recordLength) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;
     if( ! (_emitterNumber == rhs._emitterNumber) ) ivarsEqual = false;
     if( ! (_beamNumber == rhs._beamNumber) ) ivarsEqual = false;
     if( ! (_stateIndicator == rhs._stateIndicator) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;
     if( ! (_azimuthOffset == rhs._azimuthOffset) ) ivarsEqual = false;
     if( ! (_azimuthWidth == rhs._azimuthWidth) ) ivarsEqual = false;
     if( ! (_azimuthPullRate == rhs._azimuthPullRate) ) ivarsEqual = false;
     if( ! (_azimuthPullAcceleration == rhs._azimuthPullAcceleration) ) ivarsEqual = false;
     if( ! (_elevationOffset == rhs._elevationOffset) ) ivarsEqual = false;
     if( ! (_elevationWidth == rhs._elevationWidth) ) ivarsEqual = false;
     if( ! (_elevationPullRate == rhs._elevationPullRate) ) ivarsEqual = false;
     if( ! (_elevationPullAcceleration == rhs._elevationPullAcceleration) ) ivarsEqual = false;
     if( ! (_padding3 == rhs._padding3) ) ivarsEqual = false;

    return ivarsEqual;
 }